

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O3

void __thiscall
iu_Expression_x_iutest_x_Bitwise_Test::Body(iu_Expression_x_iutest_x_Bitwise_Test *this)

{
  pointer pcVar1;
  char *in_R9;
  AssertionResult iutest_ar;
  int local_23c;
  undefined1 local_238 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  AssertionHelper local_210;
  int local_1dc;
  long *local_1d8 [2];
  long local_1c8 [2];
  char local_1b8;
  undefined1 local_1b0 [32];
  bool local_190;
  ios_base local_130 [264];
  
  local_23c = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_238,&local_23c);
  local_1dc = 2;
  iutest::detail::ExpressionLHS<int>::operator&<int>
            ((ExpressionLHS<int> *)&local_210,(ExpressionLHS<int> *)local_238,&local_1dc);
  iutest::detail::ExpressionLHS<int>::GetResult
            ((AssertionResult *)local_1b0,(ExpressionLHS<int> *)&local_210,true);
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,local_1b0._0_8_,(pointer)(local_1b0._0_8_ + local_1b0._8_8_));
  local_1b8 = local_190;
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  pcVar1 = (pointer)((long)&local_210.m_part_result.super_iuCodeMessage.m_message.field_2 + 8);
  if ((pointer)local_210.m_part_result.super_iuCodeMessage.m_message._M_string_length != pcVar1) {
    operator_delete((void *)local_210.m_part_result.super_iuCodeMessage.m_message._M_string_length,
                    local_210.m_part_result.super_iuCodeMessage.m_message.field_2._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._8_8_ != &local_220) {
    operator_delete((void *)local_238._8_8_,local_220._M_allocated_capacity + 1);
  }
  if (local_1b8 == '\0') {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_238,(internal *)local_1d8,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() & 2))","false","true"
               ,in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,(char *)local_238._0_8_,(allocator<char> *)&local_23c);
    local_210.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_210.m_part_result.super_iuCodeMessage.m_line = 0x47;
    local_210.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_210,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_210.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_210.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  local_23c = 0;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_238,&local_23c);
  local_1dc = 1;
  iutest::detail::ExpressionLHS<int>::operator|<int>
            ((ExpressionLHS<int> *)&local_210,(ExpressionLHS<int> *)local_238,&local_1dc);
  iutest::detail::ExpressionLHS<int>::GetResult
            ((AssertionResult *)local_1b0,(ExpressionLHS<int> *)&local_210,true);
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,local_1b0._0_8_,(pointer)(local_1b0._0_8_ + local_1b0._8_8_));
  local_1b8 = local_190;
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if ((pointer)local_210.m_part_result.super_iuCodeMessage.m_message._M_string_length != pcVar1) {
    operator_delete((void *)local_210.m_part_result.super_iuCodeMessage.m_message._M_string_length,
                    local_210.m_part_result.super_iuCodeMessage.m_message.field_2._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._8_8_ != &local_220) {
    operator_delete((void *)local_238._8_8_,local_220._M_allocated_capacity + 1);
  }
  if (local_1b8 == '\0') {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_238,(internal *)local_1d8,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((z() | 1))","false","true"
               ,in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,(char *)local_238._0_8_,(allocator<char> *)&local_23c);
    local_210.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_210.m_part_result.super_iuCodeMessage.m_line = 0x48;
    local_210.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_210,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_210.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_210.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  return;
}

Assistant:

IUTEST(Expression, Bitwise)
{
    IUTEST_EXPECT(f() & 2);
    IUTEST_EXPECT(z() | 1);
}